

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseEncodingSynapse.cpp
# Opt level: O1

void __thiscall TemporalPhaseEncodingSynapse::update(TemporalPhaseEncodingSynapse *this)

{
  Population *pPVar1;
  long lVar2;
  TemporalPhaseEncodingSynapse_param *pTVar3;
  pointer ppEVar4;
  double *pdVar5;
  Event *pEVar6;
  Clock *pCVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (0 < this->inputSize) {
    iVar8 = 0;
    do {
      resetOutput(this);
      if (0 < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows) {
        uVar10 = 0;
        do {
          dVar12 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data[uVar10];
          dVar11 = Clock::getCurrentTime(this->clock);
          if (dVar11 < dVar12) {
LAB_0010ac80:
            pEVar6 = (Event *)operator_new(0x18);
            pEVar6->type = No;
            pEVar6->_vptr_Event = (_func_int **)&PTR_setWeight_00111ac0;
            pCVar7 = Clock::getInstance();
            dVar12 = Clock::getCurrentTime(pCVar7);
            pEVar6->eventTime = dVar12;
            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = pEVar6;
          }
          else {
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= (long)uVar10) {
LAB_0010ae20:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x1a9,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[uVar10] <= -1.0) goto LAB_0010ac80;
            pEVar6 = (Event *)operator_new(0x28);
            pEVar6->_vptr_Event = (_func_int **)&PTR_setWeight_00111a48;
            *(undefined4 *)&pEVar6[1]._vptr_Event = 1;
            *(undefined8 *)&pEVar6[1].type = 0x3ff0000000000000;
            pEVar6->type = Spike;
            pCVar7 = Clock::getInstance();
            dVar12 = Clock::getCurrentTime(pCVar7);
            pEVar6->eventTime = dVar12;
            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = pEVar6;
            (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10]->_vptr_Event)(0x4094500000000000);
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= (long)uVar10) goto LAB_0010ae20;
            (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[uVar10] = -1.0;
          }
          pPVar1 = (this->super_Synapse).to_population;
          (*pPVar1->_vptr_Population[5])
                    (pPVar1,uVar10 & 0xffffffff,
                     (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          Logging::logEvent(this->logger,(long)this,(int)uVar10,
                            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar10]->type);
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 <
                 (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows);
      }
      dVar12 = this->currentWindow;
      dVar11 = Clock::getCurrentTime(this->clock);
      if (dVar12 <= dVar11) {
        lVar2 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if (0 < lVar2) {
          pTVar3 = this->param;
          ppEVar4 = (((this->super_Synapse).from_population)->output).
                    super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar12 = (double)pTVar3->som_frequency;
          pdVar5 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          lVar9 = 0;
          do {
            dVar11 = pTVar3->window_length_s;
            dVar13 = round(((double)ppEVar4[lVar9][1]._vptr_Event * 0.8 + 0.1) * dVar11 * dVar12);
            dVar14 = dVar13 / dVar12 + this->phaseOffset;
            dVar13 = dVar11 * 0.9;
            if (dVar14 <= dVar11 * 0.9) {
              dVar13 = dVar14;
            }
            uVar10 = -(ulong)(dVar14 < dVar11 * 0.0);
            pdVar5[lVar9] =
                 (double)(~uVar10 & (ulong)dVar13 | (ulong)(dVar11 * 0.0) & uVar10) +
                 this->currentWindow;
            lVar9 = lVar9 + 1;
          } while (lVar2 != lVar9);
        }
        this->currentWindow = this->param->window_length_s + this->currentWindow;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->inputSize);
  }
  return;
}

Assistant:

void TemporalPhaseEncodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        resetOutput();
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) <= clock->getCurrentTime() && spikeTimes(j) > -1) {
                output[j] = new SpikeEvent();
                output[j]->setWeight(1300.0);
                spikeTimes(j) = -1;
            }
            else {
                output[j] = new NoEvent();
            }
            to_population->setInput(j, output[j]);
            logger->logEvent((long)this, j, output[j]->type);
        }
        if(currentWindow <= clock->getCurrentTime()) {
            for(int j = 0; j < spikeTimes.size(); j++) {
                double scaledValue = 0.1 + static_cast<ValueEvent*>(from_population->output[j])->value * 0.8;
                double vs = scaledValue * param->window_length_s;
                double bin = round(vs * param->som_frequency);
                spikeTimes(j) = currentWindow + helperFunctions::clamp(bin / param->som_frequency + phaseOffset, 0*param->window_length_s, param->window_length_s*0.9);

                // double spikeTime = floor(static_cast<ValueEvent*>(from_population->output[j])->value * param->som_frequency) * phaseStep +param->som_phase;
                // spikeTimes(j) = currentWindow + helperFunctions::clamp((spikeTime * 0.8), 0, 0.9*param->window_length_s);
            }
            currentWindow += param->window_length_s;
        }
    }
}